

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeRepresentation.hpp
# Opt level: O0

baseType count_time<9,_long>::fromCount(int64_t val,time_units units)

{
  time_units units_local;
  int64_t val_local;
  long local_8;
  
  switch(units) {
  case ps:
    local_8 = val / 1000;
    break;
  case ns:
    local_8 = val;
    break;
  case us:
    local_8 = val * 1000;
    break;
  case ms:
    local_8 = val * 1000000;
    break;
  case s:
  case sec:
  default:
    local_8 = val * 1000000000;
    break;
  case minutes:
    local_8 = val * 60000000000;
    break;
  case hr:
    local_8 = val * 3600000000000;
    break;
  case day:
    local_8 = val * 86400000000000;
  }
  return local_8;
}

Assistant:

static baseType fromCount(std::int64_t val, time_units units) noexcept
    {
        switch (units) {
            case time_units::ps:
                if constexpr (N >= 12) {
                    return static_cast<baseType>(val * fac10[N - 12]);
                } else {
                    return static_cast<baseType>(val / fac10[12 - N]);
                }
            case time_units::ns:
                if constexpr (N >= 9) {
                    return static_cast<baseType>(val * fac10[N - 9]);
                } else {
                    return static_cast<baseType>(val / fac10[9 - N]);
                }
            case time_units::us:
                if constexpr (N >= 6) {
                    return static_cast<baseType>(val * fac10[N - 6]);
                } else {
                    return static_cast<baseType>(val / fac10[6 - N]);
                }
            case time_units::ms:
                if constexpr (N >= 3) {
                    return static_cast<baseType>(val * fac10[N - 3]);
                } else {
                    return static_cast<baseType>(val / fac10[3 - N]);
                }
            case time_units::s:
            case time_units::sec:
            default:
                return static_cast<baseType>(val * iFactor);
            case time_units::minutes:
                return static_cast<baseType>(val * 60 * iFactor);
            case time_units::hr:
                return static_cast<baseType>(val * 3600 * iFactor);
            case time_units::day:
                return static_cast<baseType>(val * 86400 * iFactor);
        }
    }